

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

void __thiscall dg::vr::GraphBuilder::buildTerminators(GraphBuilder *this,Function *function)

{
  ReturnInst RVar1;
  VRLocation *last;
  mapped_type *ppVVar2;
  ReturnInst *inst;
  Function *pFVar3;
  Function *BB;
  const_succ_iterator cVar4;
  const_succ_iterator cVar5;
  BasicBlock *local_38;
  
  pFVar3 = function + 0x50;
  do {
    pFVar3 = *(Function **)pFVar3;
    if (pFVar3 == function + 0x48) {
      return;
    }
    BB = pFVar3 + -0x18;
    if (pFVar3 == (Function *)0x0) {
      BB = (Function *)0x0;
    }
    local_38 = (BasicBlock *)BB;
    ppVVar2 = std::
              map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
              ::operator[]((map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                            *)(this + 0x40),&local_38);
    last = *ppVVar2;
    inst = (ReturnInst *)llvm::BasicBlock::getTerminator();
    RVar1 = inst[0x10];
    if (inst == (ReturnInst *)0x0 || RVar1 != (ReturnInst)0x1d) {
      if (RVar1 == (ReturnInst)0x1e && inst != (ReturnInst *)0x0) {
        buildSwitch(this,(SwitchInst *)inst,last);
      }
      else if (RVar1 == (ReturnInst)0x1c && inst != (ReturnInst *)0x0) {
        buildReturn(inst,last);
      }
      else {
        cVar4 = llvm::succ_begin((BasicBlock *)BB);
        cVar5 = llvm::succ_end((BasicBlock *)BB);
        if (cVar4.Idx != cVar5.Idx) {
          abort();
        }
      }
    }
    else {
      buildBranch(this,(BranchInst *)inst,last);
    }
    pFVar3 = pFVar3 + 8;
  } while( true );
}

Assistant:

void GraphBuilder::buildTerminators(const llvm::Function &function) {
    for (const llvm::BasicBlock &block : function) {
        assert(backs.find(&block) != backs.end());
        VRLocation &last = *backs[&block];

        const llvm::Instruction *terminator = block.getTerminator();
        if (const auto *branch = llvm::dyn_cast<llvm::BranchInst>(terminator)) {
            buildBranch(branch, last);

        } else if (const auto *swtch =
                           llvm::dyn_cast<llvm::SwitchInst>(terminator)) {
            buildSwitch(swtch, last);

        } else if (const auto *rturn =
                           llvm::dyn_cast<llvm::ReturnInst>(terminator)) {
            buildReturn(rturn, last);

        } else if (llvm::succ_begin(&block) != llvm::succ_end(&block)) {
#ifndef NDEBUG
            std::cerr << "Unhandled  terminator: "
                      << dg::debug::getValName(terminator) << "\n";
            llvm::errs() << "Unhandled terminator: " << *terminator << "\n";
#endif
            abort();
        }
    }
}